

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar6;
  typed_value<bool,_char> *ptVar7;
  const_iterator cVar8;
  any *paVar9;
  cmdline *pcVar10;
  bool *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  ostream *poVar13;
  long *plVar14;
  string *psVar15;
  ArgumentsChecker argumentsChecker;
  DatFileUnpacker datFileUnpacker;
  Arguments arguments;
  variables_map vm;
  options_description argumentsDescription;
  undefined1 local_270 [16];
  undefined1 local_260 [24];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  Format local_1c0;
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_1b8 [32];
  options_description *local_198;
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  undefined1 local_150 [16];
  undefined1 local_140 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0 [48];
  long *local_b0 [2];
  long local_a0 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  long local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Arguments","");
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)local_150,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((undefined1 *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
  }
  local_208 = (undefined1  [8])boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_208,"help");
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar6->m_required = true;
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"dat2","");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_150);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"format,f",(char *)ptVar6);
  ptVar7 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_270._0_8_ = local_270._0_8_ & 0xffffffffffffff00;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)local_270);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"quiet,q",(char *)ptVar7);
  ptVar7 = (typed_value<bool,_char> *)boost::program_options::bool_switch();
  local_228._0_8_ = local_228._0_8_ & 0xffffffffffffff00;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)local_228);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"transform,t",(char *)ptVar7);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar6->m_required = true;
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"source,s",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar6->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"destination,d",(char *)ptVar6);
  if ((undefined1 *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_150);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_208,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_208)
  ;
  local_198 = (options_description *)local_b0;
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_270,(basic_command_line_parser<char> *)local_208);
  boost::program_options::store((basic_parsed_options *)local_270,(variables_map *)local_150,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_270);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_1b8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_1e0 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  local_208 = (undefined1  [8])local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"help","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)local_140,(key_type *)local_208);
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208,(ulong)((long)local_1f8 + 1));
  }
  if (cVar8._M_node == (_Base_ptr)(local_140 + 8)) {
    boost::program_options::notify((variables_map *)local_150);
    local_270._0_8_ = (pointer)local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"quiet","");
    paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    pcVar10 = (cmdline *)boost::any_cast<bool_const&>(paVar9);
    local_208[0] = *pcVar10;
    pbVar1 = (pointer)(local_228 + 0x10);
    local_228._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"transform","");
    paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    pbVar11 = boost::any_cast<bool_const&>(paVar9);
    local_208[1] = *pbVar11;
    pcVar5 = local_260 + 0x28;
    local_248._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_260 + 0x18),"source","");
    paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
    local_200._M_p = local_1f0;
    pcVar2 = (pbVar12->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,pcVar2,pcVar2 + pbVar12->_M_string_length);
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"destination","");
    paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
    local_1e0._0_8_ = &local_1d0;
    pcVar2 = (pbVar12->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e0,pcVar2,pcVar2 + pbVar12->_M_string_length);
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"format","");
    paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    pbVar12 = boost::any_cast<std::__cxx11::string_const&>(paVar9);
    iVar4 = std::__cxx11::string::compare((char *)pbVar12);
    local_1c0 = (iVar4 == 0) + FALLOUT1;
    if (local_190[0] != local_180) {
      operator_delete(local_190[0],local_180[0] + 1);
    }
    if (local_170[0] != local_160) {
      operator_delete(local_170[0],local_160[0] + 1);
    }
    if ((char *)local_248._0_8_ != pcVar5) {
      operator_delete((void *)local_248._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_248._16_8_)->_M_p + 1));
    }
    if ((pointer)local_228._0_8_ != pbVar1) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    if ((pointer)local_270._0_8_ != (pointer)local_260) {
      operator_delete((void *)local_270._0_8_,CONCAT71(local_260._1_7_,local_260[0]) + 1);
    }
    local_270._8_8_ = (pointer)0x0;
    local_260[0] = '\0';
    local_270._0_8_ = (pointer)local_260;
    bVar3 = DatUnpacker::ArgumentsChecker::check
                      ((ArgumentsChecker *)local_270,(Arguments *)local_208);
    if (bVar3) {
      local_228._8_8_ = (pointer)0x0;
      local_228[0x10] = '\0';
      local_228._0_8_ = pbVar1;
      bVar3 = DatUnpacker::DatFileUnpacker::unpack
                        ((DatFileUnpacker *)local_228,(Arguments *)local_208);
      iVar4 = 0;
      if ((!bVar3) && (iVar4 = 1, local_208[0] == (cmdline)0x0)) {
        DatUnpacker::DatFileUnpacker::getErrorMessage_abi_cxx11_
                  ((string *)(local_260 + 0x18),(DatFileUnpacker *)local_228);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(char *)local_248._0_8_,local_248._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        plVar14 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
        if ((char *)local_248._0_8_ != pcVar5) {
          operator_delete((void *)local_248._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_248._16_8_)->_M_p + 1));
        }
      }
      if ((pointer)local_228._0_8_ != pbVar1) {
        operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
      }
    }
    else {
      iVar4 = 1;
      if (local_208[0] == (cmdline)0x0) {
        psVar15 = DatUnpacker::ArgumentsChecker::getErrorMessage_abi_cxx11_
                            ((ArgumentsChecker *)local_270);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(psVar15->_M_dataplus)._M_p,
                             psVar15->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        plVar14 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
      }
    }
    if ((pointer)local_270._0_8_ != (pointer)local_260) {
      operator_delete((void *)local_270._0_8_,CONCAT71(local_260._1_7_,local_260[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != &local_1d0) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    if ((pointer)local_200._M_p != (pointer)local_1f0) {
      operator_delete(local_200._M_p,local_1f0._0_8_ + 1);
    }
  }
  else {
    iVar4 = 1;
    usage((options_description *)local_b0);
  }
  local_150._0_8_ = __cxa_throw;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_110);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)local_140);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70,local_50 - (long)local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    namespace po = boost::program_options;

    po::options_description argumentsDescription("Arguments");
    argumentsDescription.add_options()
        ("help", "Produce help message")
        ("format,f", po::value<std::string>()->required()->default_value("dat2"), "Fallout DAT file format version. 'dat1' or 'dat2'. 'dat2' is default")
        ("quiet,q", po::bool_switch()->default_value(false), "Quite mode. Do not display anything")
        ("transform,t", po::bool_switch()->default_value(false), "Transform file names to lowercase")
        ("source,s", po::value<std::string>()->required(), "Path to the DAT file")
        ("destination,d", po::value<std::string>()->required(), "Where to extract files");

    po::variables_map vm;
    po::store(po::command_line_parser(argc, argv).options(argumentsDescription).run(), vm);

    if (vm.count("help")) {
      usage(argumentsDescription);
      return 1;
    }

    try {
      po::notify(vm);
    } catch (std::exception& e) {
      std::cout << "Error: " << e.what() << std::endl;
      usage(argumentsDescription);
      return 1;
    }

    Arguments arguments = {
        vm["quiet"].as<bool>(),
        vm["transform"].as<bool>(),
        vm["source"].as<std::string>(),
        vm["destination"].as<std::string>(),
        vm["format"].as<std::string>() == "dat2" ? Format::FALLOUT2 : Format::FALLOUT1
    };

    ArgumentsChecker argumentsChecker;
    if (!argumentsChecker.check(arguments)) {
        if (!arguments.quietMode) {
            std::cerr << argumentsChecker.getErrorMessage() << std::endl << std::endl;
        }
        return 1;
    }

    DatFileUnpacker datFileUnpacker;
    if (!datFileUnpacker.unpack(arguments)) {
        if (!arguments.quietMode) {
            std::cerr << datFileUnpacker.getErrorMessage() << std::endl << std::endl;
        }
        return 1;
    }

    return 0;
}